

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void helper_booke206_tlbflush_ppc64(CPUPPCState_conflict2 *env,target_ulong type)

{
  booke206_flush_tlb(env,(uint)type >> 2 & 1 | (uint)type & 2,1);
  return;
}

Assistant:

void helper_booke206_tlbflush(CPUPPCState *env, target_ulong type)
{
    int flags = 0;

    if (type & 2) {
        flags |= BOOKE206_FLUSH_TLB1;
    }

    if (type & 4) {
        flags |= BOOKE206_FLUSH_TLB0;
    }

    booke206_flush_tlb(env, flags, 1);
}